

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::ZSTDStorage::StringInitAnalyze(ColumnData *col_data,PhysicalType type)

{
  StorageManager *pSVar1;
  idx_t iVar2;
  DBConfig *args_1;
  undefined7 in_register_00000031;
  ColumnData *this;
  CompressionInfo info;
  _func_int **local_28;
  CompressionInfo local_20;
  
  this = (ColumnData *)CONCAT71(in_register_00000031,type);
  pSVar1 = ColumnData::GetStorageManager(this);
  iVar2 = optional_idx::GetIndex(&pSVar1->storage_version);
  if (iVar2 < 4) {
    local_28 = (_func_int **)0x0;
  }
  else {
    local_20.block_manager = this->block_manager;
    args_1 = DBConfig::Get(this->info->db);
    make_uniq<duckdb::ZSTDAnalyzeState,duckdb::CompressionInfo&,duckdb::DBConfig&>
              ((duckdb *)&local_28,&local_20,args_1);
  }
  col_data->_vptr_ColumnData = local_28;
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)col_data;
}

Assistant:

unique_ptr<AnalyzeState> ZSTDStorage::StringInitAnalyze(ColumnData &col_data, PhysicalType type) {
	// check if the storage version we are writing to supports sztd
	auto &storage = col_data.GetStorageManager();
	if (storage.GetStorageVersion() < 4) {
		// compatibility mode with old versions - disable zstd
		return nullptr;
	}
	CompressionInfo info(col_data.GetBlockManager());
	auto &data_table_info = col_data.info;
	auto &attached_db = data_table_info.GetDB();
	auto &config = DBConfig::Get(attached_db);

	return make_uniq<ZSTDAnalyzeState>(info, config);
}